

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QObject_*,_int>_>::Data
          (Data<QHashPrivate::Node<QObject_*,_int>_> *this,
          Data<QHashPrivate::Node<QObject_*,_int>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  Node<QObject_*,_int> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  R_conflict2 RVar9;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  lVar6 = 0;
  for (sVar7 = 0; sVar7 != RVar9.nSpans; sVar7 = sVar7 + 1) {
    pSVar2 = other->spans;
    for (sVar8 = 0; sVar8 != 0x80; sVar8 = sVar8 + 1) {
      bVar1 = pSVar2->offsets[sVar8 + lVar6];
      if (bVar1 != 0xff) {
        pEVar3 = pSVar2[sVar7].entries;
        local_48.span = this->spans + sVar7;
        local_48.index = sVar8;
        pNVar5 = Bucket::insert(&local_48);
        pEVar3 = pEVar3 + bVar1;
        uVar4 = *(undefined8 *)((pEVar3->storage).data + 8);
        pNVar5->key = *(QObject **)(pEVar3->storage).data;
        *(undefined8 *)&pNVar5->value = uVar4;
      }
    }
    lVar6 = lVar6 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }